

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

ikey_type<unodb::mutex_db<unodb::key_view,_unodb::value_view>_> __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::to_ikey(tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          *this,key_type key)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ikey_type<unodb::mutex_db<unodb::key_view,_unodb::value_view>_> iVar1;
  __normal_iterator<const_std::byte_*,_std::span<const_std::byte,_18446744073709551615UL>_> local_38
  ;
  pause_heap_faults local_29;
  pointer pbStack_28;
  pause_heap_faults guard;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  key_type key_local;
  
  this_local = (tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)key._M_extent._M_extent_value;
  pbStack_28 = key._M_ptr;
  key_local._M_extent._M_extent_value = (size_t)this;
  pause_heap_faults::pause_heap_faults(&local_29);
  local_38._M_current =
       (byte *)std::span<const_std::byte,_18446744073709551615UL>::begin
                         ((span<const_std::byte,_18446744073709551615UL> *)&this_local);
  std::span<const_std::byte,_18446744073709551615UL>::end
            ((span<const_std::byte,_18446744073709551615UL> *)&this_local);
  std::
  make_shared<std::vector<std::byte,std::allocator<std::byte>>,__gnu_cxx::__normal_iterator<std::byte_const*,std::span<std::byte_const,18446744073709551615ul>>,__gnu_cxx::__normal_iterator<std::byte_const*,std::span<std::byte_const,18446744073709551615ul>>>
            ((__normal_iterator<const_std::byte_*,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)this,&local_38);
  pause_heap_faults::~pause_heap_faults(&local_29);
  iVar1.
  super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  iVar1.
  super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ikey_type<unodb::mutex_db<unodb::key_view,_unodb::value_view>_>)
         iVar1.
         super___shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

[[nodiscard]] ikey_type<Db> to_ikey(typename Db::key_type key) const
      noexcept(!std::is_same_v<key_type, unodb::key_view>) {
    if constexpr (std::is_same_v<key_type, unodb::key_view>) {
      // Allocate a vector, make a copy of the key into the vector,
      // and return a shared_ptr to that vector.
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      return std::make_shared<std::vector<std::byte>>(key.begin(), key.end());
    } else {
      return key;  // NOP
    }
  }